

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5efc::TestCheckCloseDoesNotHaveSideEffectsWhenPassing::RunImpl
          (TestCheckCloseDoesNotHaveSideEffectsWhenPassing *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  ScopedCurrentTest scopedResults;
  TestResults testResults;
  float local_5c;
  int local_58 [2];
  TestDetails local_50;
  ScopedCurrentTest local_30;
  TestResults local_20;
  
  (anonymous_namespace)::g_sideEffect = 0;
  UnitTest::TestResults::TestResults(&local_20,(TestReporter *)0x0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  local_30.m_oldTestResults = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  local_30.m_oldTestDetails = *ppTVar3;
  ppTVar2 = UnitTest::CurrentTest::Results();
  *ppTVar2 = &local_20;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  (anonymous_namespace)::g_sideEffect = (anonymous_namespace)::g_sideEffect + 1;
  local_58[1] = 1;
  local_58[0] = 1;
  local_5c = 0.1;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_50,*ppTVar3,0x139);
  UnitTest::CheckClose<int,int,float>(pTVar1,local_58 + 1,local_58,&local_5c,&local_50);
  ScopedCurrentTest::~ScopedCurrentTest(&local_30);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_20.m_testReporter._0_4_ = 1;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_50,*ppTVar3,0x13b);
  UnitTest::CheckEqual<int,int>
            (pTVar1,(int *)&local_20,&(anonymous_namespace)::g_sideEffect,&local_50);
  return;
}

Assistant:

TEST(CheckCloseDoesNotHaveSideEffectsWhenPassing)
{
    g_sideEffect = 0;
    {
        UnitTest::TestResults testResults;
		ScopedCurrentTest scopedResults(testResults);
        CHECK_CLOSE (1, FunctionWithSideEffects(), 0.1f);
    }
    CHECK_EQUAL(1, g_sideEffect);
}